

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brdf_plot.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
brdf_plot::get_image_data
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          brdf_plot *this)

{
  vec2 screen_coord;
  long lVar1;
  int iVar2;
  int iVar3;
  brdf_plot *this_00;
  int iVar4;
  float fVar5;
  vec3 float_color;
  ivec3 iVar6;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (__return_storage_ptr__,(long)this->_size * (long)this->_size * 3);
  iVar2 = this->_size;
  if (0 < iVar2) {
    iVar3 = 0;
    do {
      if (0 < iVar2) {
        fVar5 = (float)iVar2;
        iVar4 = 0;
        do {
          screen_coord.field_0.field_0.y = 1.0 - ((float)iVar3 + 0.5) / fVar5;
          screen_coord.field_0.field_0.x = ((float)iVar4 + 0.5) / (float)iVar2;
          this_00 = this;
          float_color = get_pixel_color(this,screen_coord);
          iVar6 = get_8bit_color(this_00,float_color);
          lVar1 = (long)(this->_size * iVar3 + iVar4) * 3;
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_start[lVar1] = iVar6.field_0._0_1_;
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_start[lVar1 + 1] = iVar6.field_0._4_1_;
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_start[lVar1 + 2] = iVar6.field_0._8_1_;
          iVar4 = iVar4 + 1;
          iVar2 = this->_size;
        } while (iVar4 < iVar2);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < iVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> brdf_plot::get_image_data()
{
  std::vector<unsigned char> image_data;
  image_data.resize(3 * _size * _size);

  for (auto y = 0; y < _size; ++y)
  {
    float dy = 1.0f - (static_cast<float>(y + 0.5f) / _size);

    for (auto x = 0; x < _size; ++x)
    {
      float dx = static_cast<float>(x + 0.5f) / _size;

      auto float_color = get_pixel_color({dx, dy});
      auto color = get_8bit_color(float_color);

      auto index = 3 * (y * _size + x);
      image_data[index + 0] = static_cast<unsigned char>(color.r);
      image_data[index + 1] = static_cast<unsigned char>(color.g);
      image_data[index + 2] = static_cast<unsigned char>(color.b);
    }
  }

  return image_data;
}